

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderStorageBufferObjectTests.cpp
# Opt level: O0

long __thiscall glcts::anon_unknown_0::BasicSyntaxSSO::Run(BasicSyntaxSSO *this)

{
  bool bVar1;
  GLuint GVar2;
  int local_dc;
  undefined1 local_d8 [4];
  int i;
  float data [12];
  allocator<char> local_91;
  string local_90;
  char *local_70;
  char *glsl_fs;
  char *glsl_vs [8];
  int kCount;
  BasicSyntaxSSO *this_local;
  
  bVar1 = ShaderStorageBufferObjectBase::IsVSFSAvailable
                    (&this->super_ShaderStorageBufferObjectBase,1,0);
  if (bVar1) {
    glsl_vs[5] = 
    "\nlayout(packed) coherent buffer Buffer {\n  vec4 position01[2];\n  vec4 position2;\n} g_buffer;\nvoid main() {\n  if (gl_VertexID == 0) gl_Position = g_buffer.position01[0];\n  else if (gl_VertexID == 1) gl_Position = g_buffer.position01[1];\n  else if (gl_VertexID == 2) gl_Position = g_buffer.position2;\n}"
    ;
    glsl_vs[6] = 
    "\nlayout(std430) coherent buffer Buffer {\n  coherent vec4 position01[2];\n  vec4 position2[];\n} g_buffer;\nvoid main() {\n  switch (gl_VertexID) {\n    case 0: gl_Position = g_buffer.position01[0]; break;\n    case 1: gl_Position = g_buffer.position01[1]; break;\n    case 2: gl_Position = g_buffer.position2[gl_VertexID - 2]; break;\n  }\n}"
    ;
    glsl_vs[3] = 
    "\nbuffer Buffer {\n  vec4 position[3];\n} g_buffer[1];\nvoid main() {\n  gl_Position = g_buffer[0].position[gl_VertexID];\n}"
    ;
    glsl_vs[4] = 
    "\nlayout(shared) coherent buffer Buffer {\n  restrict volatile vec4 position0;\n  readonly vec4 position1;\n  vec4 position2;\n} g_buffer[1];\nvoid main() {\n  if (gl_VertexID == 0) gl_Position = g_buffer[0].position0;\n  else if (gl_VertexID == 1) gl_Position = g_buffer[0].position1;\n  else if (gl_VertexID == 2) gl_Position = g_buffer[0].position2;\n}"
    ;
    glsl_vs[1] = 
    "\nlayout(std140, binding = 0) readonly buffer Buffer {\n  readonly vec4 position[];\n};\nvoid main() {\n  gl_Position = position[gl_VertexID];\n}"
    ;
    glsl_vs[2] = 
    "\nlayout(std430, column_major, std140, std430, row_major, packed, shared) buffer;\nlayout(std430) buffer;\ncoherent restrict volatile buffer Buffer {\n  restrict coherent vec4 position[];\n} g_buffer;\nvoid main() {\n  gl_Position = g_buffer.position[gl_VertexID];\n}"
    ;
    glsl_fs = 
    "\nlayout(std430) buffer Buffer {\n  vec4 position[3];\n} g_input_buffer;\nvoid main() {\n  gl_Position = g_input_buffer.position[gl_VertexID];\n}"
    ;
    glsl_vs[0] = 
    "\ncoherent buffer Buffer {\n  vec4 position0;\n  coherent vec4 position1;\n  restrict readonly vec4 position2;\n} g_input_buffer;\nvoid main() {\n  if (gl_VertexID == 0) gl_Position = g_input_buffer.position0;\n  if (gl_VertexID == 1) gl_Position = g_input_buffer.position1;\n  if (gl_VertexID == 2) gl_Position = g_input_buffer.position2;\n}"
    ;
    local_70 = 
    "\nlayout(location = 0) out vec4 o_color;\nvoid main() {\n  o_color = vec4(0.0, 1.0, 0.0, 1.0);\n}"
    ;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,
               "\nlayout(location = 0) out vec4 o_color;\nvoid main() {\n  o_color = vec4(0.0, 1.0, 0.0, 1.0);\n}"
               ,&local_91);
    GVar2 = ShaderStorageBufferObjectBase::BuildShaderProgram
                      (&this->super_ShaderStorageBufferObjectBase,0x8b30,&local_90);
    this->m_fsp = GVar2;
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator(&local_91);
    bVar1 = ShaderStorageBufferObjectBase::CheckProgram
                      (&this->super_ShaderStorageBufferObjectBase,this->m_fsp);
    if (bVar1) {
      glu::CallLogWrapper::glGenProgramPipelines
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,1,&this->m_pipeline);
      glu::CallLogWrapper::glUseProgramStages
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,this->m_pipeline,2,this->m_fsp);
      memcpy(local_d8,&DAT_02ad28d0,0x30);
      glu::CallLogWrapper::glGenBuffers
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,1,&this->m_buffer);
      glu::CallLogWrapper::glBindBufferBase
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,0,this->m_buffer);
      glu::CallLogWrapper::glBufferData
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,0x30,local_d8,0x88e4);
      glu::CallLogWrapper::glBindProgramPipeline
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,this->m_pipeline);
      glu::CallLogWrapper::glGenVertexArrays
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,1,&this->m_vertex_array);
      glu::CallLogWrapper::glBindVertexArray
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,this->m_vertex_array);
      for (local_dc = 0; local_dc < 8; local_dc = local_dc + 1) {
        bVar1 = RunIteration(this,glsl_vs[(long)local_dc + -1]);
        if (!bVar1) {
          return (long)&DAT_ffffffffffffffff;
        }
      }
      this_local = (BasicSyntaxSSO *)0x0;
    }
    else {
      this_local = (BasicSyntaxSSO *)&DAT_ffffffffffffffff;
    }
  }
  else {
    this_local = (BasicSyntaxSSO *)0x10;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		if (!IsVSFSAvailable(1, 0))
			return NOT_SUPPORTED;
		const int		  kCount		  = 8;
		const char* const glsl_vs[kCount] = {
			NL "layout(std430) buffer Buffer {" NL "  vec4 position[3];" NL "} g_input_buffer;" NL "void main() {" NL
			   "  gl_Position = g_input_buffer.position[gl_VertexID];" NL "}",
			NL "coherent buffer Buffer {" NL "  vec4 position0;" NL "  coherent vec4 position1;" NL
			   "  restrict readonly vec4 position2;" NL "} g_input_buffer;" NL "void main() {" NL
			   "  if (gl_VertexID == 0) gl_Position = g_input_buffer.position0;" NL
			   "  if (gl_VertexID == 1) gl_Position = g_input_buffer.position1;" NL
			   "  if (gl_VertexID == 2) gl_Position = g_input_buffer.position2;" NL "}",
			NL "layout(std140, binding = 0) readonly buffer Buffer {" NL "  readonly vec4 position[];" NL "};" NL
			   "void main() {" NL "  gl_Position = position[gl_VertexID];" NL "}",
			NL "layout(std430, column_major, std140, std430, row_major, packed, shared) buffer;" NL
			   "layout(std430) buffer;" NL "coherent restrict volatile buffer Buffer {" NL
			   "  restrict coherent vec4 position[];" NL "} g_buffer;" NL "void main() {" NL
			   "  gl_Position = g_buffer.position[gl_VertexID];" NL "}",
			NL "buffer Buffer {" NL "  vec4 position[3];" //
			NL "} g_buffer[1];" NL "void main() {" NL "  gl_Position = g_buffer[0].position[gl_VertexID];" NL "}",
			NL "layout(shared) coherent buffer Buffer {" NL "  restrict volatile vec4 position0;" NL
			   "  readonly vec4 position1;" NL "  vec4 position2;" NL "} g_buffer[1];" NL "void main() {" NL
			   "  if (gl_VertexID == 0) gl_Position = g_buffer[0].position0;" NL
			   "  else if (gl_VertexID == 1) gl_Position = g_buffer[0].position1;" NL
			   "  else if (gl_VertexID == 2) gl_Position = g_buffer[0].position2;" NL "}",
			NL "layout(packed) coherent buffer Buffer {" NL "  vec4 position01[2];" NL "  vec4 position2;" NL
			   "} g_buffer;" NL "void main() {" NL "  if (gl_VertexID == 0) gl_Position = g_buffer.position01[0];" NL
			   "  else if (gl_VertexID == 1) gl_Position = g_buffer.position01[1];" NL
			   "  else if (gl_VertexID == 2) gl_Position = g_buffer.position2;" NL "}",
			NL "layout(std430) coherent buffer Buffer {" NL "  coherent vec4 position01[2];" NL "  vec4 position2[];" NL
			   "} g_buffer;" NL "void main() {" NL "  switch (gl_VertexID) {" NL
			   "    case 0: gl_Position = g_buffer.position01[0]; break;" NL
			   "    case 1: gl_Position = g_buffer.position01[1]; break;" NL
			   "    case 2: gl_Position = g_buffer.position2[gl_VertexID - 2]; break;" NL "  }" NL "}",
		};

		const char* const glsl_fs = NL "layout(location = 0) out vec4 o_color;" NL "void main() {" NL
									   "  o_color = vec4(0.0, 1.0, 0.0, 1.0);" NL "}";
		m_fsp = BuildShaderProgram(GL_FRAGMENT_SHADER, glsl_fs);
		if (!CheckProgram(m_fsp))
			return ERROR;

		glGenProgramPipelines(1, &m_pipeline);
		glUseProgramStages(m_pipeline, GL_FRAGMENT_SHADER_BIT, m_fsp);

		const float data[12] = { -1.0f, -1.0f, 0.0f, 1.0f, 3.0f, -1.0f, 0.0f, 1.0f, -1.0f, 3.0f, 0.0f, 1.0f };
		glGenBuffers(1, &m_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_STATIC_DRAW);

		glBindProgramPipeline(m_pipeline);

		glGenVertexArrays(1, &m_vertex_array);
		glBindVertexArray(m_vertex_array);

		for (int i = 0; i < kCount; ++i)
		{
			if (!RunIteration(glsl_vs[i]))
				return ERROR;
		}

		return NO_ERROR;
	}